

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QControlledGate2.cpp
# Opt level: O2

void __thiscall
qclab::qgates::QControlledGate2<double>::apply
          (QControlledGate2<double> *this,Op op,int nbQubits,
          vector<double,_std::allocator<double>_> *vector,int offset)

{
  int iVar1;
  int iVar2;
  int iVar3;
  undefined4 extraout_var;
  vector<int,_std::allocator<int>_> qubits;
  anon_class_40_5_d6c92a71 f;
  SquareMatrix<double> local_80;
  _Vector_base<int,_std::allocator<int>_> local_70;
  anon_class_40_5_d6c92a71 local_58;
  
  (*(this->super_QGate2<double>).super_QObject<double>._vptr_QObject[5])(&local_70,this);
  *(ulong *)local_70._M_impl.super__Vector_impl_data._M_start =
       CONCAT44(offset + (int)((ulong)*(undefined8 *)
                                       local_70._M_impl.super__Vector_impl_data._M_start >> 0x20),
                offset + (int)*(undefined8 *)local_70._M_impl.super__Vector_impl_data._M_start);
  iVar1 = this->control_;
  iVar2 = (*(this->super_QGate2<double>).super_QObject<double>._vptr_QObject[0xf])(this);
  iVar3 = (*(this->super_QGate2<double>).super_QObject<double>._vptr_QObject[0x10])(this);
  (**(code **)(*(long *)CONCAT44(extraout_var,iVar3) + 0x38))
            (&local_80,(long *)CONCAT44(extraout_var,iVar3));
  lambda_QGate1<double>
            (&local_58,op,&local_80,
             (vector->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
             super__Vector_impl_data._M_start);
  std::unique_ptr<double[],_std::default_delete<double[]>_>::~unique_ptr(&local_80.data_);
  apply4<qclab::qgates::lambda_QGate1<double>(qclab::Op,qclab::dense::SquareMatrix<double>,double*)::_lambda(unsigned_long,unsigned_long)_1_>
            (nbQubits,*local_70._M_impl.super__Vector_impl_data._M_start,
             local_70._M_impl.super__Vector_impl_data._M_start[1],iVar1 + offset,iVar2 + offset,
             this->controlState_,&local_58);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base(&local_70);
  return;
}

Assistant:

void QControlledGate2< T >::apply( Op op ,
                                     const int nbQubits ,
                                     std::vector< T >& vector ,
                                     const int offset ) const {
    auto qubits = this->qubits() ;
    qubits[0] += offset ;
    qubits[1] += offset ;
    const int control = this->control() + offset ;
    const int target  = this->target()  + offset ;
    auto f = lambda_QGate1( op , this->gate()->matrix() , vector.data() ) ;
    apply4( nbQubits , qubits[0] , qubits[1] , control , target ,
            this->controlState() , f ) ;
  }